

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerResults.cpp
# Opt level: O2

void __thiscall
SWDAnalyzerResults::GetBubbleText
          (SWDAnalyzerResults *this,Frame *f,DisplayBase display_base,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  Frame FVar1;
  SWDRegisters reg;
  long lVar2;
  char *pcVar3;
  string *this_00;
  char *__rhs;
  string data_str;
  string reg_name;
  string reg_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string result;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  FVar1 = f[0x20];
  switch(FVar1) {
  case (Frame)0x2:
    int2str_abi_cxx11_(&reg_value,*(U64 *)(f + 0x10));
    std::operator+(&reg_name,"Line Reset ",&reg_value);
    std::operator+(&data_str,&reg_name," bits");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::~string((string *)&reg_name);
    std::__cxx11::string::~string((string *)&reg_value);
    std::__cxx11::string::string((string *)&data_str,"rst",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::string((string *)&data_str,"reset",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::string((string *)&data_str,"Line Reset",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    break;
  case (Frame)0x3:
    int2str_sal_abi_cxx11_(&data_str,(ulong)(*(uint *)(f + 0x10) >> 1 & 0xc),display_base,4);
    SWDRequestFrame::GetRegisterName_abi_cxx11_(&reg_name,(SWDRequestFrame *)f);
    std::__cxx11::string::string((string *)&local_88,"Request ",(allocator *)&local_68);
    pcVar3 = " AccessPort";
    if (((byte)f[0x21] & 2) == 0) {
      pcVar3 = " DebugPort";
    }
    std::operator+(&local_a8,&local_88,pcVar3);
    __rhs = " Read";
    pcVar3 = " Read";
    if (((byte)f[0x21] & 1) == 0) {
      pcVar3 = " Write";
    }
    std::operator+(&local_c8,&local_a8,pcVar3);
    std::operator+(&local_e8,&local_c8," ");
    std::operator+(&reg_value,&local_e8,&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &reg_value);
    std::__cxx11::string::~string((string *)&reg_value);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    int2str_sal_abi_cxx11_(&reg_value,*(U64 *)(f + 0x18),display_base,8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &reg_value);
    std::__cxx11::string::~string((string *)&reg_value);
    std::__cxx11::string::string((string *)&reg_value,"rq",(allocator *)&local_e8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &reg_value);
    std::__cxx11::string::~string((string *)&reg_value);
    std::__cxx11::string::string((string *)&reg_value,"req",(allocator *)&local_e8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &reg_value);
    std::__cxx11::string::~string((string *)&reg_value);
    std::__cxx11::string::string((string *)&reg_value,"request",(allocator *)&local_e8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &reg_value);
    std::__cxx11::string::~string((string *)&reg_value);
    std::__cxx11::string::string((string *)&local_88,"request ",(allocator *)&local_68);
    pcVar3 = "AP";
    if (((byte)f[0x21] & 2) == 0) {
      pcVar3 = "DP";
    }
    std::operator+(&local_a8,&local_88,pcVar3);
    pcVar3 = " R";
    if (((byte)f[0x21] & 1) == 0) {
      pcVar3 = " W";
    }
    std::operator+(&local_c8,&local_a8,pcVar3);
    std::operator+(&local_e8,&local_c8," ");
    std::operator+(&reg_value,&local_e8,&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &reg_value);
    std::__cxx11::string::~string((string *)&reg_value);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string((string *)&local_88,"Request ",(allocator *)&local_68);
    pcVar3 = " AccessPort";
    if (((byte)f[0x21] & 2) == 0) {
      pcVar3 = " DebugPort";
    }
    std::operator+(&local_a8,&local_88,pcVar3 + 1);
    if (((byte)f[0x21] & 1) == 0) {
      __rhs = " Write";
    }
    std::operator+(&local_c8,&local_a8,__rhs);
    std::operator+(&local_e8,&local_c8," ");
    std::operator+(&reg_value,&local_e8,&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &reg_value);
    std::__cxx11::string::~string((string *)&reg_value);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = &local_88;
    goto LAB_0010793a;
  case (Frame)0x4:
    std::__cxx11::string::string((string *)&data_str,"Turnaround",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::string((string *)&data_str,"T",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::string((string *)&data_str,"trn",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::string((string *)&data_str,"turn",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    break;
  case (Frame)0x5:
    lVar2 = *(long *)(f + 0x10);
    if (lVar2 == 4) {
      std::__cxx11::string::string((string *)&data_str,"ACK FAULT",(allocator *)&reg_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &data_str);
      std::__cxx11::string::~string((string *)&data_str);
      std::__cxx11::string::string((string *)&data_str,"FAULT",(allocator *)&reg_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &data_str);
    }
    else if (lVar2 == 2) {
      std::__cxx11::string::string((string *)&data_str,"ACK WAIT",(allocator *)&reg_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &data_str);
      std::__cxx11::string::~string((string *)&data_str);
      std::__cxx11::string::string((string *)&data_str,"WAIT",(allocator *)&reg_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &data_str);
    }
    else if (lVar2 == 1) {
      std::__cxx11::string::string((string *)&data_str,"ACK OK",(allocator *)&reg_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &data_str);
      std::__cxx11::string::~string((string *)&data_str);
      std::__cxx11::string::string((string *)&data_str,"OK",(allocator *)&reg_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &data_str);
    }
    else {
      std::__cxx11::string::string
                ((string *)&data_str,"ACK <unknown> probably disconnected",(allocator *)&reg_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &data_str);
      std::__cxx11::string::~string((string *)&data_str);
      std::__cxx11::string::string((string *)&data_str,"ACK <unknown>",(allocator *)&reg_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &data_str);
      std::__cxx11::string::~string((string *)&data_str);
      std::__cxx11::string::string((string *)&data_str,"disc",(allocator *)&reg_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &data_str);
    }
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::string((string *)&data_str,"ACK",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    break;
  case (Frame)0x6:
    int2str_sal_abi_cxx11_(&data_str,*(U64 *)(f + 0x10),display_base,0x20);
    reg = *(SWDRegisters *)(f + 0x18);
    GetRegisterName_abi_cxx11_(&reg_name,reg);
    GetRegisterValueDesc_abi_cxx11_(&reg_value,reg,*(U32 *)(f + 0x10),display_base);
    if (reg_value._M_string_length != 0) {
      std::operator+(&local_68,"WData ",&data_str);
      std::operator+(&local_88,&local_68," reg ");
      std::operator+(&local_a8,&local_88,&reg_name);
      std::operator+(&local_c8,&local_a8," bits ");
      std::operator+(&local_e8,&local_c8,&reg_value);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
    }
    std::operator+(&local_a8,"WData ",&data_str);
    std::operator+(&local_c8,&local_a8," reg ");
    std::operator+(&local_e8,&local_c8,&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string((string *)&local_e8,"WData",(allocator *)&local_c8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::operator+(&local_e8,"WData ",&data_str);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    this_00 = &reg_value;
LAB_0010793a:
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)&reg_name);
    break;
  case (Frame)0x7:
    std::__cxx11::string::string((string *)&reg_name,"Data parity",(allocator *)&reg_value);
    pcVar3 = "ok";
    if (*(long *)(f + 0x18) == 0) {
      pcVar3 = "NOT OK";
    }
    std::operator+(&data_str,&reg_name,pcVar3);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::~string((string *)&reg_name);
    pcVar3 = "BD1";
    if (*(long *)(f + 0x10) == 0) {
      pcVar3 = "BD0";
    }
    std::__cxx11::string::string((string *)&data_str,pcVar3 + 2,(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::string((string *)&data_str,"prty",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::string((string *)&data_str,"Parity",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    break;
  case (Frame)0x8:
    std::__cxx11::string::string((string *)&data_str,"Trailing bits",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    std::__cxx11::string::~string((string *)&data_str);
    std::__cxx11::string::string((string *)&data_str,"Trail",(allocator *)&reg_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &data_str);
    break;
  default:
    data_str._M_dataplus._M_p = (pointer)&data_str.field_2;
    data_str._M_string_length = 0;
    data_str.field_2._M_local_buf[0] = '\0';
    if (FVar1 == (Frame)0x0) {
      std::__cxx11::string::assign((char *)&data_str);
    }
    else if (FVar1 == (Frame)0x1) {
      int2str_abi_cxx11_(&reg_value,*(U64 *)(f + 0x18));
      std::operator+(&reg_name,"bit ",&reg_value);
      std::__cxx11::string::operator=((string *)&data_str,(string *)&reg_name);
      std::__cxx11::string::~string((string *)&reg_name);
      std::__cxx11::string::~string((string *)&reg_value);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&data_str);
  }
  std::__cxx11::string::~string((string *)&data_str);
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

void SWDAnalyzerResults::GetBubbleText( const Frame& f, DisplayBase display_base, std::vector<std::string>& results )
{
    results.clear();

    std::string result;

    if( f.mType == SWDFT_Request )
    {
        SWDRequestFrame& req( ( SWDRequestFrame& )f );

        std::string addr_str( int2str_sal( req.GetAddr(), display_base, 4 ) );
        std::string reg_name( req.GetRegisterName() );

        results.push_back( std::string( "Request " ) + ( req.IsAccessPort() ? " AccessPort" : " DebugPort" ) +
                           ( req.IsRead() ? " Read" : " Write" ) + " " + reg_name );

        results.push_back( int2str_sal( req.mData2, display_base ) );
        results.push_back( "rq" );
        results.push_back( "req" );
        results.push_back( "request" );
        results.push_back( std::string( "request " ) + ( req.IsAccessPort() ? "AP" : "DP" ) + ( req.IsRead() ? " R" : " W" ) + " " +
                           reg_name );

        results.push_back( std::string( "Request " ) + ( req.IsAccessPort() ? "AccessPort" : "DebugPort" ) +
                           ( req.IsRead() ? " Read" : " Write" ) + " " + reg_name );
    }
    else if( f.mType == SWDFT_LineReset )
    {
        results.push_back( "Line Reset " + int2str( f.mData1 ) + " bits" );
        results.push_back( "rst" );
        results.push_back( "reset" );
        results.push_back( "Line Reset" );
    }
    else if( f.mType == SWDFT_Turnaround )
    {
        results.push_back( "Turnaround" );
        results.push_back( "T" );
        results.push_back( "trn" );
        results.push_back( "turn" );
    }
    else if( f.mType == SWDFT_ACK )
    {
        if( f.mData1 == ACK_OK )
        {
            results.push_back( "ACK OK" );
            results.push_back( "OK" );
        }
        else if( f.mData1 == ACK_WAIT )
        {
            results.push_back( "ACK WAIT" );
            results.push_back( "WAIT" );
        }
        else if( f.mData1 == ACK_FAULT )
        {
            results.push_back( "ACK FAULT" );
            results.push_back( "FAULT" );
        }
        else
        {
            results.push_back( "ACK <unknown> probably disconnected" );
            results.push_back( "ACK <unknown>" );
            results.push_back( "disc" );
        }

        results.push_back( "ACK" );
    }
    else if( f.mType == SWDFT_WData )
    {
        std::string data_str( int2str_sal( f.mData1, display_base, 32 ) );
        SWDRegisters reg( SWDRegisters( f.mData2 ) );
        std::string reg_name( GetRegisterName( reg ) );
        std::string reg_value( GetRegisterValueDesc( reg, U32( f.mData1 ), display_base ) );

        if( !reg_value.empty() )
            results.push_back( "WData " + data_str + " reg " + reg_name + " bits " + reg_value );
        results.push_back( "WData " + data_str + " reg " + reg_name );
        results.push_back( "WData" );
        results.push_back( "WData " + data_str );
    }
    else if( f.mType == SWDFT_DataParity )
    {
        results.push_back( std::string( "Data parity" ) + ( f.mData2 ? "ok" : "NOT OK" ) );
        results.push_back( f.mData1 ? "1" : "0" );
        results.push_back( "prty" );
        results.push_back( "Parity" );
    }
    else if( f.mType == SWDFT_TrailingBits )
    {
        results.push_back( "Trailing bits" );
        results.push_back( "Trail" );
    }
    else
    {
        std::string msg;

        switch( f.mType )
        {
        case SWDFT_Bit:
            msg = "bit " + int2str( f.mData2 );
            break;
        case SWDFT_WData:
            msg = "data";
            break;
        case SWDFT_DataParity:
            msg = "dprty";
            break;
        case SWDFT_Error:
            msg = "err";
            break;
        case SWDFT_Request:
            msg = "request";
            break;
        }

        results.push_back( msg );
    }
}